

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wait_cthread.cpp
# Opt level: O1

__pid_t __thiscall sc_core::wait(sc_core *this,void *__stat_loc)

{
  sc_thread_process *this_00;
  __pid_t extraout_EAX;
  __pid_t extraout_EAX_00;
  __pid_t _Var1;
  int iVar2;
  stringstream msg;
  char *local_1c0;
  char local_1b0 [16];
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  iVar2 = (int)this;
  if (iVar2 < 1) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"n = ",4);
    std::ostream::operator<<((ostream *)local_190,iVar2);
    std::__cxx11::stringbuf::str();
    sc_report_handler::report
              (SC_ERROR,"wait(n) is only valid for n > 0",local_1c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait_cthread.cpp"
               ,0x44);
    if (local_1c0 != local_1b0) {
      operator_delete(local_1c0);
    }
    std::__cxx11::stringstream::~stringstream(local_1a0);
  }
  if ((*(uint *)((long)__stat_loc + 0x48) & 0xfffffffe) == 2) {
    this_00 = *(sc_thread_process **)((long)__stat_loc + 0x40);
    if ((this_00->super_sc_process_b).m_unwinding == true) {
      sc_report_handler::report
                (SC_ERROR,"wait() not allowed during unwinding",
                 (this_00->super_sc_process_b).super_sc_object.m_name._M_dataplus._M_p,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_thread_process.h"
                 ,0x183);
    }
    if (iVar2 < 1) {
      sc_report_handler::report
                (SC_ERROR,"wait(n) not allowed for n <= 0",
                 (this_00->super_sc_process_b).super_sc_object.m_name._M_dataplus._M_p,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_thread_process.h"
                 ,0x186);
    }
    this_00->m_wait_cycle_n = iVar2 + -1;
    sc_thread_process::suspend_me(this_00);
    _Var1 = extraout_EAX;
  }
  else {
    sc_report_handler::report
              (SC_ERROR,"wait() is only allowed in SC_THREADs and SC_CTHREADs",
               "\n        in SC_METHODs use next_trigger() instead",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_wait_cthread.cpp"
               ,0x4d);
    _Var1 = extraout_EAX_00;
  }
  return _Var1;
}

Assistant:

void
wait( int n, sc_simcontext* simc )
{
    sc_curr_proc_handle cpi = simc->get_curr_proc_info();
    if( n <= 0 ) {
        std::stringstream msg;
        msg << "n = " << n;
        SC_REPORT_ERROR( SC_ID_WAIT_N_INVALID_, msg.str().c_str() );
    }
    switch( cpi->kind ) {
      case SC_THREAD_PROC_:
      case SC_CTHREAD_PROC_:
        reinterpret_cast<sc_thread_handle>( cpi->process_handle )->wait_cycles( n );
        break;
      default:
        SC_REPORT_ERROR( SC_ID_WAIT_NOT_ALLOWED_, "\n        "
	                 "in SC_METHODs use next_trigger() instead" );
        break;
    }
}